

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O2

void __thiscall tt::Logger::~Logger(Logger *this)

{
  string *v;
  LogStream *pLVar1;
  Buffer *msg;
  
  pLVar1 = LogStream::operator<<((LogStream *)this,"--");
  v = &(this->m_impl).m_basename;
  pLVar1 = LogStream::operator<<(pLVar1,v);
  pLVar1 = LogStream::operator<<(pLVar1," : ");
  pLVar1 = LogStream::operator<<(pLVar1,(this->m_impl).m_line);
  LogStream::operator<<(pLVar1,"\n");
  msg = &(this->m_impl).m_stream.m_buffer;
  output(msg->m_data,*(int *)&(this->m_impl).m_stream.m_buffer.m_cur - (int)msg);
  std::__cxx11::string::~string((string *)v);
  return;
}

Assistant:

Logger::~Logger(){
	
	m_impl.m_stream << "--" << m_impl.m_basename << " : " 
		<< m_impl.m_line << "\n";
	
	const LogStream::Buffer& buf(stream().buffer());

	output(buf.data(), buf.length());
}